

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_30c12::createDFDUnpackedTest3_FormatSRGB8_Test::TestBody
          (createDFDUnpackedTest3_FormatSRGB8_Test *this)

{
  bool bVar1;
  int iVar2;
  AssertHelper *this_00;
  char *in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  uint32_t *dfd;
  AssertHelper *this_01;
  uint *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  int line;
  char *in_stack_ffffffffffffff50;
  Type in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff64;
  ktx_uint8_t in_stack_ffffffffffffff6c;
  ktx_uint8_t in_stack_ffffffffffffff6d;
  ktx_uint8_t in_stack_ffffffffffffff6e;
  ktx_uint8_t in_stack_ffffffffffffff6f;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_ffffffffffffff70;
  initializer_list<(anonymous_namespace)::createDFDTestBase<3U,_3U>::sampleType>
  in_stack_ffffffffffffff80;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffa8;
  undefined1 local_48 [48];
  undefined1 *local_18;
  undefined8 local_10;
  
  memcpy(local_48,&DAT_001dada4,0x30);
  local_18 = local_48;
  local_10 = 3;
  this_01 = (AssertHelper *)0x3;
  createDFDTestBaseUncomp<3U,_3U>::customize
            ((createDFDTestBaseUncomp<3U,_3U> *)
             in_stack_ffffffffffffff70._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,in_stack_ffffffffffffff6f,in_stack_ffffffffffffff6e,
             in_stack_ffffffffffffff6d,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff80);
  this_00 = (AssertHelper *)createDFDUnpacked(0,3,1,0,8);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_RDI,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,(unsigned_long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffa0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    in_stack_ffffffffffffff40 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1459cc);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50,(int)((ulong)in_RDI >> 0x20),
               in_stack_ffffffffffffff40);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)in_stack_ffffffffffffffa8._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper(this_01);
    testing::Message::~Message((Message *)0x145a1a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x145a6d);
  iVar2 = memcmp(in_RDI + 0x10,(void *)((long)&this_00->data_ + 4),0x48);
  uVar3 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_RDI,in_stack_ffffffffffffff40,(int *)in_stack_ffffffffffffff38,(int *)this_01);
  line = (int)((ulong)in_RDI >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff68);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(iVar2,uVar3));
    testing::AssertionResult::failure_message((AssertionResult *)0x145af4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(iVar2,uVar3),in_stack_ffffffffffffff5c,
               in_stack_ffffffffffffff50,line,in_stack_ffffffffffffff40);
    testing::internal::AssertHelper::operator=
              (this_00,(Message *)in_stack_ffffffffffffffa8._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper(this_01);
    testing::Message::~Message((Message *)0x145b42);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x145b92);
  free(this_00);
  return;
}

Assistant:

TEST_F(createDFDUnpackedTest3, FormatSRGB8) {
    customize(KHR_DF_MODEL_RGBSDA, KHR_DF_PRIMARIES_BT709,
              KHR_DF_TRANSFER_SRGB, KHR_DF_FLAG_ALPHA_STRAIGHT,
              {
                {0, 7, KHR_DF_CHANNEL_RGBSDA_RED, 0, 0, 0, 0, 0, 255},
                {8, 7, KHR_DF_CHANNEL_RGBSDA_GREEN, 0, 0, 0, 0, 0, 255},
                {16, 7, KHR_DF_CHANNEL_RGBSDA_BLUE, 0, 0, 0, 0, 0, 255},
              }
             );

    uint32_t* dfd = createDFDUnpacked(KTX_FALSE, 3, 1, KTX_FALSE, s_SRGB);

    EXPECT_EQ(*dfd, sizeof(expected) + 4U);
    EXPECT_EQ(memcmp(&expected, dfd+1, sizeof(expected)), 0);

    free(dfd);
}